

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O3

int I420ToRGB565Dither(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,
                      uint8_t *src_v,int src_stride_v,uint8_t *dst_rgb565,int dst_stride_rgb565,
                      uint8_t *dither4x4,int width,int height)

{
  int iVar1;
  uint uVar2;
  void *__ptr;
  ulong uVar3;
  code *pcVar4;
  code *pcVar5;
  int iVar6;
  uint uVar7;
  uint8_t *puVar8;
  code *pcVar9;
  undefined1 auVar10 [16];
  uint local_84;
  
  auVar10._0_4_ = -(uint)(src_y == (uint8_t *)0x0);
  auVar10._4_4_ = -(uint)(src_u == (uint8_t *)0x0);
  auVar10._8_4_ = -(uint)(src_v == (uint8_t *)0x0);
  auVar10._12_4_ = -(uint)(dst_rgb565 == (uint8_t *)0x0);
  iVar6 = movmskps((int)src_u,auVar10);
  iVar1 = -1;
  if ((height != 0 && 0 < width) && iVar6 == 0) {
    if (height < 0) {
      local_84 = -height;
      dst_rgb565 = dst_rgb565 + ~height * dst_stride_rgb565;
      dst_stride_rgb565 = -dst_stride_rgb565;
    }
    else {
      local_84 = height;
    }
    puVar8 = "";
    if (dither4x4 != (uint8_t *)0x0) {
      puVar8 = dither4x4;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 7U) == 0) {
      pcVar9 = I422ToARGBRow_SSSE3;
    }
    else {
      pcVar9 = I422ToARGBRow_Any_SSSE3;
    }
    if ((uVar2 & 0x40) == 0) {
      pcVar9 = I422ToARGBRow_C;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 0xfU) == 0) {
      pcVar4 = I422ToARGBRow_AVX2;
    }
    else {
      pcVar4 = I422ToARGBRow_Any_AVX2;
    }
    if ((uVar2 >> 10 & 1) == 0) {
      pcVar4 = pcVar9;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 3U) == 0) {
      pcVar9 = ARGBToRGB565DitherRow_SSE2;
    }
    else {
      pcVar9 = ARGBToRGB565DitherRow_Any_SSE2;
    }
    if ((uVar2 & 0x20) == 0) {
      pcVar9 = ARGBToRGB565DitherRow_C;
    }
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    if ((width & 7U) == 0) {
      pcVar5 = ARGBToRGB565DitherRow_AVX2;
    }
    else {
      pcVar5 = ARGBToRGB565DitherRow_Any_AVX2;
    }
    if ((uVar2 >> 10 & 1) == 0) {
      pcVar5 = pcVar9;
    }
    __ptr = malloc((ulong)(width * 4 + 0x3f));
    uVar3 = (long)__ptr + 0x3fU & 0xffffffffffffffc0;
    uVar7 = 0;
    uVar2 = 0;
    do {
      (*pcVar4)(src_y,src_u,src_v,uVar3,&kYuvI601Constants,width);
      (*pcVar5)(uVar3,dst_rgb565,*(undefined4 *)(puVar8 + (uVar7 & 0xc)),width);
      dst_rgb565 = dst_rgb565 + dst_stride_rgb565;
      src_y = src_y + src_stride_y;
      src_v = src_v + (int)(-(uVar2 & 1) & src_stride_v);
      src_u = src_u + (int)(-(uVar2 & 1) & src_stride_u);
      uVar2 = uVar2 + 1;
      uVar7 = uVar7 + 4;
    } while (local_84 != uVar2);
    free(__ptr);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I420ToRGB565Dither(const uint8_t* src_y,
                       int src_stride_y,
                       const uint8_t* src_u,
                       int src_stride_u,
                       const uint8_t* src_v,
                       int src_stride_v,
                       uint8_t* dst_rgb565,
                       int dst_stride_rgb565,
                       const uint8_t* dither4x4,
                       int width,
                       int height) {
  int y;
  void (*I422ToARGBRow)(const uint8_t* y_buf, const uint8_t* u_buf,
                        const uint8_t* v_buf, uint8_t* rgb_buf,
                        const struct YuvConstants* yuvconstants, int width) =
      I422ToARGBRow_C;
  void (*ARGBToRGB565DitherRow)(const uint8_t* src_argb, uint8_t* dst_rgb,
                                const uint32_t dither4, int width) =
      ARGBToRGB565DitherRow_C;
  if (!src_y || !src_u || !src_v || !dst_rgb565 || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_rgb565 = dst_rgb565 + (height - 1) * dst_stride_rgb565;
    dst_stride_rgb565 = -dst_stride_rgb565;
  }
  if (!dither4x4) {
    dither4x4 = kDither565_4x4;
  }
#if defined(HAS_I422TOARGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    I422ToARGBRow = I422ToARGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGBRow = I422ToARGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_I422TOARGBROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    I422ToARGBRow = I422ToARGBRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      I422ToARGBRow = I422ToARGBRow_AVX2;
    }
  }
#endif
#if defined(HAS_I422TOARGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    I422ToARGBRow = I422ToARGBRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGBRow = I422ToARGBRow_NEON;
    }
  }
#endif
#if defined(HAS_I422TOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    I422ToARGBRow = I422ToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      I422ToARGBRow = I422ToARGBRow_MMI;
    }
  }
#endif
#if defined(HAS_I422TOARGBROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    I422ToARGBRow = I422ToARGBRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGBRow = I422ToARGBRow_MSA;
    }
  }
#endif
#if defined(HAS_ARGBTORGB565DITHERROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_Any_SSE2;
    if (IS_ALIGNED(width, 4)) {
      ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_SSE2;
    }
  }
#endif
#if defined(HAS_ARGBTORGB565DITHERROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_Any_AVX2;
    if (IS_ALIGNED(width, 8)) {
      ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_AVX2;
    }
  }
#endif
#if defined(HAS_ARGBTORGB565DITHERROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_NEON;
    }
  }
#endif
#if defined(HAS_ARGBTORGB565DITHERROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_MMI;
    }
  }
#endif
#if defined(HAS_ARGBTORGB565DITHERROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      ARGBToRGB565DitherRow = ARGBToRGB565DitherRow_MSA;
    }
  }
#endif
  {
    // Allocate a row of argb.
    align_buffer_64(row_argb, width * 4);
    for (y = 0; y < height; ++y) {
      I422ToARGBRow(src_y, src_u, src_v, row_argb, &kYuvI601Constants, width);
      ARGBToRGB565DitherRow(row_argb, dst_rgb565,
                            *(const uint32_t*)(dither4x4 + ((y & 3) << 2)),
                            width);
      dst_rgb565 += dst_stride_rgb565;
      src_y += src_stride_y;
      if (y & 1) {
        src_u += src_stride_u;
        src_v += src_stride_v;
      }
    }
    free_aligned_buffer_64(row_argb);
  }
  return 0;
}